

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
::deinit(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
         *this)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_zeroData,&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
  deinit(&this->
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        );
  return;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::deinit (void)
{
	m_zeroData = std::vector<deUint8>();

	BasicBufferCase<SampleType>::deinit();
}